

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

token * libchars::lexer(string *str)

{
  char cVar1;
  uint uVar2;
  token *ptVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  token *this;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  ulong uStack_70;
  string local_68 [32];
  token *local_48;
  string *local_40;
  token *local_38;
  
  uVar5 = str->_M_string_length;
  uVar9 = 0;
  uVar7 = 0;
  local_38 = (token *)0x0;
  local_48 = (token *)0x0;
  uVar8 = 0;
  local_40 = str;
  do {
    uStack_70 = 4;
    if (uVar8 < uVar5) {
      pcVar6 = (char *)std::__cxx11::string::at((ulong)local_40);
      cVar1 = *pcVar6;
      uStack_70 = 4;
      if (cVar1 != '\0') {
        if (cVar1 == '\"') {
          uStack_70 = 2;
        }
        else if (cVar1 == '\\') {
          uStack_70 = 3;
        }
        else {
          iVar4 = isspace((int)cVar1);
          if (cVar1 == '=') {
            uStack_70 = 0;
          }
          else {
            uStack_70 = 0;
            if (iVar4 == 0) {
              iVar4 = isprint((int)cVar1);
              uStack_70 = (ulong)(iVar4 != 0);
            }
          }
        }
      }
    }
    uVar2 = (&lex_transitions)[uVar9 * 5 + uStack_70];
    this = local_38;
    ptVar3 = local_48;
    if ((((uVar2 & 0xc0) != 0) && (uVar7 < uVar8)) && (uVar7 < local_40->_M_string_length)) {
      this = (token *)operator_new(0x90);
      token::token(this,UNKNOWN,-1,0,(char *)0x0);
      this->status = (uint)(((int)uVar9 - 2U & 0xfffffffd) == 0) << 10 | 0x10;
      this->offset = uVar7;
      this->length = (uVar8 + ((uVar2 >> 7 & 1) != 0)) - uVar7;
      std::__cxx11::string::substr((ulong)local_68,(ulong)local_40);
      std::__cxx11::string::operator=((string *)this,local_68);
      std::__cxx11::string::~string(local_68);
      ptVar3 = this;
      if (local_38 != (token *)0x0) {
        local_38->next = this;
        ptVar3 = local_48;
      }
    }
    local_48 = ptVar3;
    if ((uVar2 & 0x10) != 0) {
      uVar7 = uVar8;
    }
    uVar5 = local_40->_M_string_length;
    uVar9 = (ulong)(uVar2 & 0xf);
    bVar10 = uVar8 < uVar5;
    uVar8 = uVar8 + 1;
    local_38 = this;
  } while (bVar10);
  return local_48;
}

Assistant:

token *lexer(const std::string &str)
    {
        token *t_tail = NULL;
        token *t_head = NULL;
        size_t offset = 0, offset_start = 0;
        uint32_t state = S_WS;
        do {
            char c = (offset < str.length()) ? str.at(offset) : 0;
            lex_inputs x = X_WS;
            if (c == 0)
                x = X_EOL;
            else if (c == '\\')
                x = X_ESC;
            else if (c == '"')
                x = X_Q;
            else if (isspace(c) || c == '=')
                x = X_WS;
            else if (isprint(c))
                x = X_A0;

            uint32_t tr = lex_transitions[state][x];
            if ((tr & (A_PUSH|A_EOTP)) != 0) {
                // character part of existing token
            }
            if ((tr & (A_EOT|A_EOTP)) != 0) {
                // end of token (if not empty)
                if (offset > offset_start && offset_start < str.length()) {
                    token *T = new token;
                    T->status = token::IN_STRING;
                    if (state == S_STR || state == S_E2)
                        T->status |= token::IS_QUOTED;
                    T->offset = offset_start;
                    T->length = offset - offset_start;
                    if (tr & A_EOTP) ++T->length;
                    T->value = str.substr(T->offset,T->length);
                    if (t_head == NULL) {
                        t_head = t_tail = T;
                    }
                    else {
                        t_head->next = T;
                        t_head = T;
                    }
                }
            }
            if ((tr & A_SOT) != 0) {
                // new token
                offset_start = offset;
            }
            state = tr & 0x0f;
        } while (offset++ < str.length());

        return t_tail;
    }